

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

Matrix4x4 * CMU462::Matrix4x4::identity(void)

{
  double *pdVar1;
  Matrix4x4 *in_RDI;
  Matrix4x4 *B;
  
  Matrix4x4(in_RDI);
  pdVar1 = operator()(in_RDI,0,0);
  *pdVar1 = 1.0;
  pdVar1 = operator()(in_RDI,0,1);
  *pdVar1 = 0.0;
  pdVar1 = operator()(in_RDI,0,2);
  *pdVar1 = 0.0;
  pdVar1 = operator()(in_RDI,0,3);
  *pdVar1 = 0.0;
  pdVar1 = operator()(in_RDI,1,0);
  *pdVar1 = 0.0;
  pdVar1 = operator()(in_RDI,1,1);
  *pdVar1 = 1.0;
  pdVar1 = operator()(in_RDI,1,2);
  *pdVar1 = 0.0;
  pdVar1 = operator()(in_RDI,1,3);
  *pdVar1 = 0.0;
  pdVar1 = operator()(in_RDI,2,0);
  *pdVar1 = 0.0;
  pdVar1 = operator()(in_RDI,2,1);
  *pdVar1 = 0.0;
  pdVar1 = operator()(in_RDI,2,2);
  *pdVar1 = 1.0;
  pdVar1 = operator()(in_RDI,2,3);
  *pdVar1 = 0.0;
  pdVar1 = operator()(in_RDI,3,0);
  *pdVar1 = 0.0;
  pdVar1 = operator()(in_RDI,3,1);
  *pdVar1 = 0.0;
  pdVar1 = operator()(in_RDI,3,2);
  *pdVar1 = 0.0;
  pdVar1 = operator()(in_RDI,3,3);
  *pdVar1 = 1.0;
  return in_RDI;
}

Assistant:

Matrix4x4 Matrix4x4::identity( void ) {
    Matrix4x4 B;

    B(0,0) = 1.; B(0,1) = 0.; B(0,2) = 0.; B(0,3) = 0.;
    B(1,0) = 0.; B(1,1) = 1.; B(1,2) = 0.; B(1,3) = 0.;
    B(2,0) = 0.; B(2,1) = 0.; B(2,2) = 1.; B(2,3) = 0.;
    B(3,0) = 0.; B(3,1) = 0.; B(3,2) = 0.; B(3,3) = 1.;

    return B;
  }